

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O0

void floodRoutingTablePacket(void)

{
  bool bVar1;
  char *ipAddress;
  undefined1 local_58 [8];
  sockaddr_in router_address;
  Link *link;
  iterator __end1;
  iterator __begin1;
  vector<Link,_std::allocator<Link>_> *__range1;
  packet_t tablePacket;
  
  makeTableIntoPacket_abi_cxx11_();
  __end1 = std::vector<Link,_std::allocator<Link>_>::begin(&links);
  link = (Link *)std::vector<Link,_std::allocator<Link>_>::end(&links);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                                *)&link);
    if (!bVar1) break;
    router_address.sin_zero =
         (uchar  [8])
         __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::operator*
                   (&__end1);
    ipAddress = (char *)std::__cxx11::string::data();
    _local_58 = getInetSocketAddress(ipAddress,0x128b,2);
    Socket::writeString(&socketLocal,(sockaddr_in *)local_58,(string *)&__range1);
    __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::operator++
              (&__end1);
  }
  std::__cxx11::string::~string((string *)&__range1);
  return;
}

Assistant:

void floodRoutingTablePacket() {
	auto tablePacket = makeTableIntoPacket();
//	for (const auto &neighbor:neighbors) {
//		sockaddr_in router_address = getInetSocketAddress(neighbor.data(), 4747);
//		socketLocal.writeString(router_address, tablePacket);
//	}
	for (const auto &link:links) {
		sockaddr_in router_address = getInetSocketAddress(link.neighbor.data(), 4747);
		socketLocal.writeString(router_address, tablePacket);
	}
}